

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int>::on_num
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int> *this)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  ushort uVar4;
  locale *plVar5;
  basic_format_specs<char> *pbVar6;
  bool bVar7;
  char cVar8;
  uint uVar9;
  numpunct *pnVar10;
  char *pcVar11;
  buffer_appender<char> bVar12;
  uint uVar13;
  uint uVar14;
  long *plVar15;
  long *plVar16;
  long *plVar17;
  long lVar18;
  ulong uVar19;
  int iVar20;
  uint uVar21;
  char *pcVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  int iVar26;
  buffer<char> *buf;
  string groups;
  char digits [40];
  long *local_2a8;
  long local_2a0;
  long local_298 [2];
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int> *local_288;
  long local_280;
  char local_278 [48];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  
  plVar5 = (locale *)(this->locale).locale_;
  if (plVar5 == (locale *)0x0) {
    std::locale::locale((locale *)&local_248);
  }
  else {
    std::locale::locale((locale *)&local_248,plVar5);
  }
  pnVar10 = std::use_facet<std::__cxx11::numpunct<char>>((locale *)&local_248);
  (**(code **)(*(long *)pnVar10 + 0x20))(&local_2a8,pnVar10);
  std::locale::~locale((locale *)&local_248);
  if (local_2a0 == 0) {
    on_dec(this);
  }
  else {
    plVar5 = (locale *)(this->locale).locale_;
    if (plVar5 == (locale *)0x0) {
      std::locale::locale((locale *)&local_248);
    }
    else {
      std::locale::locale((locale *)&local_248,plVar5);
    }
    pnVar10 = std::use_facet<std::__cxx11::numpunct<char>>((locale *)&local_248);
    cVar8 = (**(code **)(*(long *)pnVar10 + 0x18))(pnVar10);
    std::locale::~locale((locale *)&local_248);
    if (cVar8 == '\0') {
      on_dec(this);
    }
    else {
      uVar14 = this->abs_value;
      uVar9 = 0x1f;
      if ((uVar14 | 1) != 0) {
        for (; (uVar14 | 1) >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      uVar4 = *(ushort *)(bsr2log10(int)::data + (ulong)uVar9 * 2);
      uVar23 = (uint)uVar4 -
               (uint)(uVar14 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32_new +
                                        (ulong)uVar4 * 4));
      iVar26 = -(uint)(uVar14 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32_new +
                                         (ulong)uVar4 * 4));
      plVar17 = (long *)((long)local_2a8 + local_2a0);
      plVar16 = local_2a8;
      uVar9 = uVar23;
      uVar13 = uVar23;
      if (local_2a0 != 0) {
        plVar15 = local_2a8;
        lVar18 = local_2a0;
        uVar24 = uVar23;
        do {
          cVar2 = (char)*plVar15;
          uVar21 = uVar13 - (int)cVar2;
          plVar16 = plVar15;
          uVar9 = uVar24;
          if ((uVar21 == 0 || (int)uVar13 < (int)cVar2) || ((byte)(cVar2 + 0x81U) < 0x82)) break;
          uVar24 = uVar24 + 1;
          plVar15 = (long *)((long)plVar15 + 1);
          lVar18 = lVar18 + -1;
          plVar16 = plVar17;
          uVar9 = (int)local_2a0 + iVar26 + (uint)uVar4;
          uVar13 = uVar21;
        } while (lVar18 != 0);
      }
      if (plVar16 == plVar17) {
        uVar9 = (int)(uVar13 - 1) / (int)*(char *)((long)plVar17 + -1) + uVar9;
      }
      pcVar11 = local_278 + (int)uVar23;
      uVar13 = uVar14;
      if (99 < uVar14) {
        do {
          uVar14 = uVar13 / 100;
          *(undefined2 *)(pcVar11 + -2) =
               *(undefined2 *)(basic_data<void>::digits + (ulong)(uVar13 % 100) * 2);
          pcVar11 = pcVar11 + -2;
          bVar7 = 9999 < uVar13;
          uVar13 = uVar13 / 100;
        } while (bVar7);
      }
      if (uVar14 < 10) {
        pcVar11[-1] = (byte)uVar14 | 0x30;
      }
      else {
        *(undefined2 *)(pcVar11 + -2) =
             *(undefined2 *)(basic_data<void>::digits + (ulong)uVar14 * 2);
      }
      local_248.super_buffer<char>.size_ = 0;
      local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_0014f558;
      local_248.super_buffer<char>.ptr_ = local_248.store_;
      local_248.super_buffer<char>.capacity_ = 500;
      uVar9 = uVar9 + this->prefix_size;
      uVar25 = (ulong)uVar9;
      if (500 < uVar9) {
        basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow(&local_248,uVar25);
      }
      pcVar11 = local_248.super_buffer<char>.ptr_;
      local_248.super_buffer<char>.size_ = local_248.super_buffer<char>.capacity_;
      if (uVar25 <= local_248.super_buffer<char>.capacity_) {
        local_248.super_buffer<char>.size_ = uVar25;
      }
      local_280 = (long)(int)uVar9;
      pcVar22 = local_248.super_buffer<char>.ptr_ + local_280 + -1;
      if (1 < (int)uVar23) {
        uVar19 = (ulong)uVar23;
        iVar20 = iVar26 + (uint)uVar4 + 1;
        iVar26 = 0;
        plVar17 = local_2a8;
        do {
          uVar19 = uVar19 - 1;
          pcVar1 = pcVar22 + -1;
          *pcVar22 = local_278[uVar19 & 0xffffffff];
          cVar2 = (char)*plVar17;
          if ('\0' < cVar2) {
            iVar26 = iVar26 + 1;
            if ((cVar2 != '\x7f') && (iVar26 % (int)cVar2 == 0)) {
              if ((long *)((long)plVar17 + 1) != (long *)((long)local_2a8 + local_2a0)) {
                iVar26 = 0;
                plVar17 = (long *)((long)plVar17 + 1);
              }
              pcVar22[-1] = cVar8;
              pcVar1 = pcVar22 + -2;
            }
          }
          pcVar22 = pcVar1;
          iVar20 = iVar20 + -1;
        } while (2 < iVar20);
      }
      *pcVar22 = local_278[0];
      if (this->prefix_size != 0) {
        pcVar22[-1] = '-';
      }
      pbVar6 = this->specs;
      uVar19 = 0;
      if (uVar25 <= (uint)pbVar6->width) {
        uVar19 = (uint)pbVar6->width - uVar25;
      }
      bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
           (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
      bVar3 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                       (ulong)((byte)pbVar6->field_0x9 & 0xf));
      local_288 = this;
      if (*(ulong *)((long)bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                           container + 0x18) <
          *(long *)((long)bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                          container + 0x10) + uVar25 + (pbVar6->fill).size_ * uVar19) {
        (*(code *)**(undefined8 **)
                    bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                  (bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      }
      uVar25 = uVar19 >> (bVar3 & 0x3f);
      bVar12 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar12,uVar25,&pbVar6->fill);
      bVar12 = std::__copy_move<false,false,std::random_access_iterator_tag>::
               __copy_m<char*,fmt::v7::detail::buffer_appender<char>>
                         (pcVar11,pcVar11 + local_280,bVar12);
      bVar12 = fill<fmt::v7::detail::buffer_appender<char>,char>
                         (bVar12,uVar19 - uVar25,&pbVar6->fill);
      (local_288->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (buffer<char> *)
           bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
      if (local_248.super_buffer<char>.ptr_ != local_248.store_) {
        operator_delete(local_248.super_buffer<char>.ptr_,local_248.super_buffer<char>.capacity_);
      }
    }
  }
  if (local_2a8 != local_298) {
    operator_delete(local_2a8,local_298[0] + 1);
  }
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += static_cast<int>(prefix_size);
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size - 1;
    for (int i = num_digits - 1; i > 0; --i) {
      *p-- = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
      p -= s.size();
    }
    *p-- = static_cast<Char>(*digits);
    if (prefix_size != 0) *p = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }